

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O1

int __thiscall
soplex::SPxHarrisRT<double>::selectLeave
          (SPxHarrisRT<double> *this,double *val,double param_2,bool param_3)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  double *pdVar5;
  long lVar6;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long lVar7;
  undefined7 in_register_00000011;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  double dVar12;
  Real RVar13;
  int local_dc;
  double max;
  double *local_d0;
  double local_c8;
  undefined8 uStack_c0;
  double maxabs;
  double local_a8;
  ulong uStack_a0;
  double local_98;
  ulong uStack_90;
  Real local_88;
  ulong uStack_80;
  long local_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  double local_38;
  undefined4 extraout_var_02;
  undefined4 extraout_var_06;
  
  maxabs = 1.0;
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])
                    (this,val,CONCAT71(in_register_00000011,param_3));
  local_88 = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var,iVar3) + 0x1b8));
  uStack_80 = extraout_XMM0_Qb;
  local_68 = degenerateEps(this);
  uStack_60 = extraout_XMM0_Qb_00;
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar1 = *(long *)(CONCAT44(extraout_var_00,iVar3) + 0x6a8);
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar2 = *(long **)(CONCAT44(extraout_var_01,iVar3) + 0x6a8);
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar4 = CONCAT44(extraout_var_02,iVar3);
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar9 = CONCAT44(extraout_var_03,iVar3);
  max = *val;
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_38 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x368))
                               ((long *)CONCAT44(extraout_var_04,iVar3));
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var_05,iVar3) + 0x6a8) + 0x20));
  local_d0 = val;
  local_70 = lVar9;
  if (max <= local_88) {
    if (-local_88 <= max) {
      return -1;
    }
    minDelta(this,&maxabs,&max,*(int *)(lVar1 + 0x28),*(int **)(lVar1 + 0x30),
             *(double **)(lVar1 + 0x40),(double *)*plVar2,*(double **)(lVar9 + 0x688),
             *(double **)(lVar4 + 0x670));
    if ((max == *local_d0) && (!NAN(max) && !NAN(*local_d0))) {
      return -1;
    }
    ::soplex::infinity::__tls_init();
    pdVar5 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_c8 = *pdVar5;
    uStack_c0 = 0;
    if (0 < (long)*(int *)(lVar1 + 0x28)) {
      dVar11 = maxabs * local_88 * 0.001;
      local_48 = local_88;
      if (local_88 <= dVar11) {
        local_48 = dVar11;
      }
      uStack_40 = uStack_80;
      dVar11 = -local_48;
      uStack_90 = uStack_80 ^ 0x8000000000000000;
      local_58 = -local_68;
      uStack_50 = uStack_60 ^ 0x8000000000000000;
      lVar9 = (long)*(int *)(lVar1 + 0x28) + 1;
      local_dc = -1;
      local_a8 = 0.0;
      RVar13 = local_88;
      local_98 = dVar11;
      do {
        lVar7 = *(long *)(lVar1 + 0x30);
        iVar3 = *(int *)(lVar7 + -8 + lVar9 * 4);
        lVar8 = (long)iVar3;
        dVar10 = *(double *)(*(long *)(lVar1 + 0x40) + lVar8 * 8);
        if (dVar11 <= dVar10) {
          if (dVar10 <= local_48) {
            *(undefined8 *)(*(long *)(lVar1 + 0x40) + lVar8 * 8) = 0;
            iVar3 = *(int *)(lVar1 + 0x28);
            *(int *)(lVar1 + 0x28) = iVar3 + -1;
            *(undefined4 *)(lVar7 + -8 + lVar9 * 4) = *(undefined4 *)(lVar7 + -4 + (long)iVar3 * 4);
          }
          else {
            dVar12 = *(double *)(*(long *)(local_70 + 0x688) + lVar8 * 8) -
                     *(double *)(*plVar2 + lVar8 * 8);
            if (local_68 < dVar12) {
              iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
              lVar6 = CONCAT44(extraout_var_09,iVar3);
              dVar11 = *(double *)(*plVar2 + lVar8 * 8);
              lVar7 = *(long *)(lVar6 + 0x688);
              dVar10 = *(double *)(lVar7 + lVar8 * 8);
              dVar12 = (double)-(ulong)(dVar11 < dVar10);
              dVar10 = dVar10 - dVar11;
              goto LAB_002352d8;
            }
            dVar12 = dVar12 / dVar10;
            if ((max <= dVar12) && (dVar12 < RVar13 + local_c8)) goto LAB_00235353;
          }
        }
        else {
          dVar12 = *(double *)(*(long *)(lVar4 + 0x670) + lVar8 * 8) -
                   *(double *)(*plVar2 + lVar8 * 8);
          if (local_58 <= dVar12) {
            dVar12 = dVar12 / dVar10;
            if ((max <= dVar12) && (dVar12 < RVar13 + local_c8)) {
              dVar10 = -dVar10;
LAB_00235353:
              if (local_a8 < dVar10) {
                uStack_c0 = 0;
                local_dc = iVar3;
                local_c8 = dVar12;
                local_a8 = dVar10;
              }
            }
          }
          else {
            iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
            lVar6 = CONCAT44(extraout_var_08,iVar3);
            dVar11 = *(double *)(*plVar2 + lVar8 * 8);
            lVar7 = *(long *)(lVar6 + 0x670);
            dVar10 = *(double *)(lVar7 + lVar8 * 8);
            dVar12 = dVar11 - dVar10;
            dVar10 = (double)-(ulong)(dVar10 < dVar11);
LAB_002352d8:
            *(double *)(lVar6 + 0x380) =
                 (double)((ulong)dVar10 & (ulong)dVar12) + *(double *)(lVar6 + 0x380);
            *(double *)(lVar7 + lVar8 * 8) = dVar11;
            RVar13 = local_88;
            dVar11 = local_98;
          }
        }
        lVar9 = lVar9 + -1;
      } while (1 < lVar9);
      goto LAB_00235382;
    }
  }
  else {
    maxDelta(this,&maxabs,&max,*(int *)(lVar1 + 0x28),*(int **)(lVar1 + 0x30),
             *(double **)(lVar1 + 0x40),(double *)*plVar2,*(double **)(lVar9 + 0x688),
             *(double **)(lVar4 + 0x670));
    if ((max == *local_d0) && (!NAN(max) && !NAN(*local_d0))) {
      return -1;
    }
    ::soplex::infinity::__tls_init();
    pdVar5 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_c8 = -*pdVar5;
    uStack_c0 = 0x8000000000000000;
    if (0 < (long)*(int *)(lVar1 + 0x28)) {
      dVar10 = maxabs * local_88 * 0.001;
      dVar11 = local_88;
      if (local_88 <= dVar10) {
        dVar11 = dVar10;
      }
      local_58 = -dVar11;
      uStack_50 = uStack_80 ^ 0x8000000000000000;
      local_48 = -local_68;
      uStack_40 = uStack_60 ^ 0x8000000000000000;
      lVar9 = (long)*(int *)(lVar1 + 0x28) + 1;
      local_dc = -1;
      local_98 = 0.0;
      uStack_a0 = uStack_80;
      RVar13 = local_88;
      local_a8 = dVar11;
      do {
        lVar7 = *(long *)(lVar1 + 0x30);
        iVar3 = *(int *)(lVar7 + -8 + lVar9 * 4);
        lVar8 = (long)iVar3;
        dVar10 = *(double *)(*(long *)(lVar1 + 0x40) + lVar8 * 8);
        if (dVar10 <= dVar11) {
          if (local_58 <= dVar10) {
            *(undefined8 *)(*(long *)(lVar1 + 0x40) + lVar8 * 8) = 0;
            iVar3 = *(int *)(lVar1 + 0x28);
            *(int *)(lVar1 + 0x28) = iVar3 + -1;
            *(undefined4 *)(lVar7 + -8 + lVar9 * 4) = *(undefined4 *)(lVar7 + -4 + (long)iVar3 * 4);
          }
          else {
            dVar12 = *(double *)(*(long *)(local_70 + 0x688) + lVar8 * 8) -
                     *(double *)(*plVar2 + lVar8 * 8);
            if (local_68 < dVar12) {
              iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
              lVar6 = CONCAT44(extraout_var_07,iVar3);
              dVar11 = *(double *)(*plVar2 + lVar8 * 8);
              lVar7 = *(long *)(lVar6 + 0x688);
              dVar10 = *(double *)(lVar7 + lVar8 * 8);
              dVar12 = (double)-(ulong)(dVar11 < dVar10);
              dVar10 = dVar10 - dVar11;
              goto LAB_00235024;
            }
            dVar12 = dVar12 / dVar10;
            if ((dVar12 <= max) && (local_c8 - RVar13 < dVar12)) {
              dVar10 = -dVar10;
              goto LAB_002350aa;
            }
          }
        }
        else {
          dVar12 = *(double *)(*(long *)(lVar4 + 0x670) + lVar8 * 8) -
                   *(double *)(*plVar2 + lVar8 * 8);
          if (local_48 <= dVar12) {
            dVar12 = dVar12 / dVar10;
            if ((dVar12 <= max) && (local_c8 - RVar13 < dVar12)) {
LAB_002350aa:
              if (local_98 < dVar10) {
                uStack_c0 = 0;
                local_dc = iVar3;
                local_c8 = dVar12;
                local_98 = dVar10;
              }
            }
          }
          else {
            iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
            lVar6 = CONCAT44(extraout_var_06,iVar3);
            dVar11 = *(double *)(*plVar2 + lVar8 * 8);
            lVar7 = *(long *)(lVar6 + 0x670);
            dVar10 = *(double *)(lVar7 + lVar8 * 8);
            dVar12 = dVar11 - dVar10;
            dVar10 = (double)-(ulong)(dVar10 < dVar11);
LAB_00235024:
            *(double *)(lVar6 + 0x380) =
                 (double)((ulong)dVar10 & (ulong)dVar12) + *(double *)(lVar6 + 0x380);
            *(double *)(lVar7 + lVar8 * 8) = dVar11;
            RVar13 = local_88;
            dVar11 = local_a8;
          }
        }
        lVar9 = lVar9 + -1;
      } while (1 < lVar9);
      goto LAB_00235382;
    }
  }
  local_dc = -1;
LAB_00235382:
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  dVar11 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar3) + 0x368))
                             ((long *)CONCAT44(extraout_var_10,iVar3));
  if ((local_38 != dVar11) || (NAN(local_38) || NAN(dVar11))) {
    local_dc = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[7])(0,this,local_d0,0);
  }
  else {
    *local_d0 = local_c8;
  }
  return local_dc;
}

Assistant:

int SPxHarrisRT<R>::selectLeave(R& val, R, bool)
{
   int i, j;
   R stab, x, y;
   R max;
   R sel;
   R lastshift;
   R useeps;
   int leave = -1;
   R maxabs = 1;

   R epsilon  = this->solver()->epsilon();
   R degeneps = degenerateEps();

   SSVectorBase<R>& upd = this->solver()->fVec().delta();
   VectorBase<R>& vec = this->solver()->fVec();

   const VectorBase<R>& up = this->solver()->ubBound();
   const VectorBase<R>& low = this->solver()->lbBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   max = val;
   lastshift = this->solver()->shift();

   this->solver()->fVec().delta().setup();

   if(max > epsilon)
   {
      // phase 1:
      maxDelta(
         &maxabs,             /* max abs value in upd */
         &max,                /* initial and chosen value */
         upd.size(),          /* # of indices in upd */
         upd.indexMem(),      /* nonzero indices in upd */
         upd.values(),        /* update VectorBase<R> for vec */
         vec.get_const_ptr(),         /* current VectorBase<R> */
         low.get_const_ptr(),                 /* lower bounds for vec */
         up.get_const_ptr()                   /* upper bounds for vec */
      );

      if(max == val)
         return -1;


      // phase 2:
      stab = 0;
      sel = R(-infinity);
      useeps = maxabs * epsilon * 0.001;

      if(useeps < epsilon)
         useeps = epsilon;

      for(j = upd.size() - 1; j >= 0; --j)
      {
         i = upd.index(j);
         x = upd[i];

         if(x > useeps)
         {
            y = up[i] - vec[i];

            if(y < -degeneps)
               this->solver()->shiftUBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y <= max && y > sel - epsilon && x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = x;
               }
            }
         }
         else if(x < -useeps)
         {
            y = low[i] - vec[i];

            if(y > degeneps)
               this->solver()->shiftLBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y <= max && y > sel - epsilon && -x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = -x;
               }
            }
         }
         else
            upd.clearNum(j);
      }
   }


   else if(max < -epsilon)
   {
      // phase 1:
      minDelta(
         &maxabs,             /* max abs value in upd */
         &max,                /* initial and chosen value */
         upd.size(),          /* # of indices in upd */
         upd.indexMem(),      /* nonzero indices in upd */
         upd.values(),        /* update VectorBase<R> for vec */
         vec.get_const_ptr(),                 /* current VectorBase<R> */
         low.get_const_ptr(),                 /* lower bounds for vec */
         up.get_const_ptr()                   /* upper bounds for vec */
      );

      if(max == val)
         return -1;

      // phase 2:
      stab = 0;
      sel = R(infinity);
      useeps = maxabs * epsilon * 0.001;

      if(useeps < epsilon)
         useeps = epsilon;

      for(j = upd.size() - 1; j >= 0; --j)
      {
         i = upd.index(j);
         x = upd[i];

         if(x < -useeps)
         {
            y = up[i] - vec[i];

            if(y < -degeneps)
               this->solver()->shiftUBbound(i, vec[i]);   // ensure simplex improvement
            else
            {
               y /= x;

               if(y >= max && y < sel + epsilon && -x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = -x;
               }
            }
         }
         else if(x > useeps)
         {
            y = low[i] - vec[i];

            if(y > degeneps)
               this->solver()->shiftLBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y >= max && y < sel + epsilon && x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = x;
               }
            }
         }
         else
            upd.clearNum(j);
      }
   }

   else
      return -1;


   if(lastshift != this->solver()->shift())
      return selectLeave(val, 0, false);

   assert(leave >= 0);

   val = sel;
   return leave;
}